

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRequest.cpp
# Opt level: O2

void xmrig::JsonRequest::create(Document *doc,int64_t id,char *method,Value *params)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t sVar1;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_40.s = "id";
  local_40.length = 2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<long>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_40,id,allocator);
  local_50.s = "jsonrpc";
  local_50.length = 7;
  local_60.s = "2.0";
  local_60.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_50,&local_60,allocator);
  local_70.s = "method";
  local_80.s = method;
  local_70.length = 6;
  sVar1 = strlen(method);
  local_80.length = (SizeType)sVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_70,&local_80,allocator);
  local_90.s = "params";
  local_90.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_90,params,allocator);
  return;
}

Assistant:

void xmrig::JsonRequest::create(rapidjson::Document &doc, int64_t id, const char *method, rapidjson::Value &params)
{
    auto &allocator = doc.GetAllocator();

    doc.AddMember("id",      id, allocator);
    doc.AddMember("jsonrpc", "2.0", allocator);
    doc.AddMember("method",  rapidjson::StringRef(method), allocator);
    doc.AddMember("params",  params, allocator);
}